

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

int32_t __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::compute_volume
          (fm_operator<ymfm::opn_registers_base<false>_> *this,uint32_t phase,uint32_t am_offset)

{
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  if (this->m_env_attenuation < 0x381) {
    uVar1 = (this->m_cache).waveform[phase & 0x3ff];
    uVar2 = envelope_attenuation(this,am_offset);
    uVar3 = (uVar1 & 0x7fff) + uVar2 * 4;
    uVar4 = (uint)(*(ushort *)
                    (attenuation_to_volume(unsigned_int)::s_power_table + ((ulong)uVar3 & 0xff) * 2)
                  >> ((byte)(uVar3 >> 8) & 0x1f));
    uVar3 = -uVar4;
    if (-1 < (short)uVar1) {
      uVar3 = uVar4;
    }
  }
  return uVar3;
}

Assistant:

int32_t fm_operator<RegisterType>::compute_volume(uint32_t phase, uint32_t am_offset) const
{
	// the low 10 bits of phase represents a full 2*PI period over
	// the full sin wave

	// early out if the envelope is effectively off
	if (m_env_attenuation > EG_QUIET)
		return 0;

	// get the absolute value of the sin, as attenuation, as a 4.8 fixed point value
	uint32_t sin_attenuation = m_cache.waveform[phase & (RegisterType::WAVEFORM_LENGTH - 1)];

	// get the attenuation from the evelope generator as a 4.6 value, shifted up to 4.8
	uint32_t env_attenuation = envelope_attenuation(am_offset) << 2;

	// combine into a 5.8 value, then convert from attenuation to 13-bit linear volume
	int32_t result = attenuation_to_volume((sin_attenuation & 0x7fff) + env_attenuation);

	// negate if in the negative part of the sin wave (sign bit gives 14 bits)
	return bitfield(sin_attenuation, 15) ? -result : result;
}